

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_remove_filter(bcf_hdr_t *hdr,bcf1_t *line,int flt_id,int pass)

{
  int local_2c;
  int i;
  int pass_local;
  int flt_id_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  if ((line->unpacked & 2U) == 0) {
    bcf_unpack(line,2);
  }
  for (local_2c = 0; (local_2c < (line->d).n_flt && (flt_id != (line->d).flt[local_2c]));
      local_2c = local_2c + 1) {
  }
  if (local_2c != (line->d).n_flt) {
    (line->d).shared_dirty = (line->d).shared_dirty | 4;
    if (local_2c != (line->d).n_flt + -1) {
      memmove((line->d).flt + local_2c,(line->d).flt + (long)local_2c + 1,
              (long)(((line->d).n_flt - local_2c) + -1) << 2);
    }
    (line->d).n_flt = (line->d).n_flt + -1;
    if (((line->d).n_flt == 0) && (pass != 0)) {
      bcf_add_filter(hdr,line,0);
    }
  }
  return 0;
}

Assistant:

int bcf_remove_filter(const bcf_hdr_t *hdr, bcf1_t *line, int flt_id, int pass)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( flt_id==line->d.flt[i] ) break;
    if ( i==line->d.n_flt ) return 0;   // the filter is not present
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    if ( i!=line->d.n_flt-1 ) memmove(line->d.flt+i,line->d.flt+i+1,(line->d.n_flt-i-1)*sizeof(*line->d.flt));
    line->d.n_flt--;
    if ( !line->d.n_flt && pass ) bcf_add_filter(hdr,line,0);
    return 0;
}